

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ensembletobin.cpp
# Opt level: O3

void ensembletobin::doit(void)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  Ensemble q;
  char line [4096];
  undefined1 local_1040 [4];
  undefined1 local_103c [4];
  char local_1038 [4104];
  
  fgets(local_1038,0x1000,_stdin);
  pcVar2 = fgets(local_1038,0x1000,_stdin);
  if (pcVar2 != (char *)0x0) {
    uVar3 = 1;
    do {
      iVar1 = __isoc99_sscanf(local_1038,"%d,%d",local_1040,local_103c);
      if (iVar1 != 2) {
        fprintf(_stderr,"FATAL: Invalid data in line %d:\n%s",(ulong)uVar3,local_1038);
        return;
      }
      fwrite(local_1040,8,1,_stdout);
      uVar3 = uVar3 + 1;
      pcVar2 = fgets(local_1038,0x1000,_stdin);
    } while (pcVar2 != (char *)0x0);
  }
  return;
}

Assistant:

void doit() {

    Ensemble q;
    char line[4096];
    int lineno = 0;
    fgets(line, sizeof(line), stdin);   // Read column headings
    lineno++;

    // Read data
    while(fgets(line, sizeof(line), stdin) != 0) {
      if (sscanf(line, "%d,%d", &q.sidx, &q.ensemble_id) != 2) {

	fprintf(stderr, "FATAL: Invalid data in line %d:\n%s", lineno, line);
	return;

      } else {

	fwrite(&q, sizeof(q), 1, stdout);

      }
      lineno++;
    }

  }